

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O0

Vec_Str_t * Wlc_ConvertToRadix(uint *pBits,int Start,int nBits,int Radix)

{
  int iVar1;
  Vec_Str_t *p;
  Vec_Str_t *p_00;
  char *pRes_00;
  char *pAdd;
  int local_44;
  int i;
  char *pSum;
  char *pRes;
  Vec_Str_t *vSum;
  Vec_Str_t *vRes;
  int Radix_local;
  int nBits_local;
  int Start_local;
  uint *pBits_local;
  
  p = Vec_StrStart(nBits);
  p_00 = Vec_StrStart(nBits);
  pRes_00 = Vec_StrArray(p);
  pAdd = Vec_StrArray(p_00);
  if ((1 < Radix) && (Radix < 0x24)) {
    *pAdd = '\x01';
    for (local_44 = 0; local_44 < nBits; local_44 = local_44 + 1) {
      iVar1 = Abc_InfoHasBit(pBits,Start + local_44);
      if (iVar1 != 0) {
        Wlc_ComputeSum(pRes_00,pAdd,nBits,Radix);
      }
      if (local_44 < nBits + -1) {
        Wlc_ComputeSum(pAdd,pAdd,nBits,Radix);
      }
    }
    Vec_StrFree(p_00);
    for (local_44 = nBits + -1; (-1 < local_44 && (pRes_00[local_44] == '\0'));
        local_44 = local_44 + -1) {
    }
    Vec_StrShrink(p,local_44 + 1);
    for (; -1 < local_44; local_44 = local_44 + -1) {
      if (pRes_00[local_44] < '\n') {
        pRes_00[local_44] = pRes_00[local_44] + '0';
      }
      else {
        pRes_00[local_44] = pRes_00[local_44] + 'W';
      }
    }
    Vec_StrReverseOrder(p);
    iVar1 = Vec_StrSize(p);
    if (iVar1 == 0) {
      Vec_StrPush(p,'0');
    }
    Vec_StrPush(p,'\0');
    return p;
  }
  __assert_fail("Radix >= 2 && Radix < 36",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                ,0x44,"Vec_Str_t *Wlc_ConvertToRadix(unsigned int *, int, int, int)");
}

Assistant:

Vec_Str_t * Wlc_ConvertToRadix( unsigned * pBits, int Start, int nBits, int Radix )
{
    Vec_Str_t * vRes = Vec_StrStart( nBits );
    Vec_Str_t * vSum = Vec_StrStart( nBits );
    char * pRes = Vec_StrArray( vRes );
    char * pSum = Vec_StrArray( vSum );  int i;
    assert( Radix >= 2 && Radix < 36 );
    pSum[0] = 1;
    // compute number
    for ( i = 0; i < nBits; i++ )
    {
        if ( Abc_InfoHasBit(pBits, Start + i) )
            Wlc_ComputeSum( pRes, pSum, nBits, Radix );
        if ( i < nBits - 1 )
            Wlc_ComputeSum( pSum, pSum, nBits, Radix );
    }
    Vec_StrFree( vSum );
    // remove zeros
    for ( i = nBits - 1; i >= 0; i-- )
        if ( pRes[i] )
            break;
    Vec_StrShrink( vRes, i+1 );
    // convert to chars
    for ( ; i >= 0; i-- )
    {
        if ( pRes[i] < 10 )
            pRes[i] += '0';
        else
            pRes[i] += 'a' - 10;
    }
    Vec_StrReverseOrder( vRes );
    if ( Vec_StrSize(vRes) == 0 )
        Vec_StrPush( vRes, '0' );
    Vec_StrPush( vRes, '\0' );
    return vRes;
}